

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_convolver_tests.cpp
# Opt level: O3

void __thiscall ConvolutionTest::run_real_convolve(ConvolutionTest *this,Context *ctx)

{
  uint *puVar1;
  anon_enum_32 aVar2;
  uint uVar3;
  _Head_base<0UL,_ear::dsp::block_convolver::BlockConvolver_*,_false> _Var4;
  PointerType in;
  pointer pMVar5;
  size_t sVar6;
  BlockConvolver *this_00;
  int *piVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
  convolver;
  vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
  filters;
  ArithmeticSequence<long,_long,_Eigen::internal::FixedInt<1>_> block_sel;
  Filter filter;
  _Head_base<0UL,_ear::dsp::block_convolver::BlockConvolver_*,_false> local_f0;
  vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
  local_e8;
  DenseBase<Eigen::Matrix<float,_1,1,0,_1,1>> *local_d0;
  DenseBase<Eigen::Matrix<float,_1,1,0,_1,1>> *local_c8;
  int *local_c0;
  ArithmeticSequence<long,_long,_Eigen::internal::FixedInt<1>_> local_b8;
  type local_a0;
  type local_68;
  
  local_e8.
  super__Vector_base<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar5 = (this->irs).
           super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->irs).
      super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pMVar5) {
    lVar10 = 8;
    uVar9 = 0;
    do {
      ear::dsp::block_convolver::Filter::Filter
                ((Filter *)&local_a0,ctx,
                 *(size_t *)
                  ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                          m_storage.m_data + lVar10),*(real_t **)((long)pMVar5 + lVar10 + -8));
      sVar6 = ear::dsp::block_convolver::Filter::num_blocks((Filter *)&local_a0);
      if (this->max_num_blocks < sVar6) {
        sVar6 = ear::dsp::block_convolver::Filter::num_blocks((Filter *)&local_a0);
        this->max_num_blocks = sVar6;
      }
      std::
      vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
      ::emplace_back<ear::dsp::block_convolver::Filter>(&local_e8,(Filter *)&local_a0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_a0.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
          super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_rows
          .m_value != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a0.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
                   super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                   .super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                   .m_rows.m_value);
      }
      uVar9 = uVar9 + 1;
      pMVar5 = (this->irs).
               super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x10;
    } while (uVar9 < (ulong)((long)(this->irs).
                                   super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >> 4));
  }
  local_f0._M_head_impl = (BlockConvolver *)0x0;
  aVar2 = this->constructor;
  if (aVar2 == NO_FILTER) {
    this_00 = (BlockConvolver *)operator_new(8);
    ear::dsp::block_convolver::BlockConvolver::BlockConvolver(this_00,ctx,this->max_num_blocks);
  }
  else if (aVar2 == WITH_FILTER_NUM_BLOCKS) {
    this_00 = (BlockConvolver *)operator_new(8);
    ear::dsp::block_convolver::BlockConvolver::BlockConvolver
              (this_00,ctx,
               local_e8.
               super__Vector_base<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
               ._M_impl.super__Vector_impl_data._M_start + this->initial_ir,this->max_num_blocks);
  }
  else {
    if (aVar2 != WITH_FILTER_NO_NUM_BLOCKS) goto LAB_00117753;
    this_00 = (BlockConvolver *)operator_new(8);
    ear::dsp::block_convolver::BlockConvolver::BlockConvolver
              (this_00,ctx,
               local_e8.
               super__Vector_base<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
               ._M_impl.super__Vector_impl_data._M_start + this->initial_ir,0);
  }
  _Var4._M_head_impl = local_f0._M_head_impl;
  bVar11 = local_f0._M_head_impl != (BlockConvolver *)0x0;
  local_f0._M_head_impl = this_00;
  if (bVar11) {
    ear::dsp::block_convolver::BlockConvolver::~BlockConvolver(_Var4._M_head_impl);
    operator_delete(_Var4._M_head_impl,8);
  }
LAB_00117753:
  Eigen::internal::is_malloc_allowed_impl(bool,bool)::value = 0;
  if (-1 < (long)this->initial_ir) {
    ear::dsp::block_convolver::BlockConvolver::set_filter
              (local_f0._M_head_impl,
               local_e8.
               super__Vector_base<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
               ._M_impl.super__Vector_impl_data._M_start + this->initial_ir);
  }
  if (this->num_blocks != 0) {
    local_c0 = &this->initial_ir;
    local_c8 = (DenseBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&this->input;
    local_d0 = (DenseBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&this->real_output;
    uVar9 = 0;
    do {
      local_b8.m_size = this->block_size;
      local_b8.m_first = local_b8.m_size * uVar9;
      puVar1 = (uint *)((this->ir_for_block).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar9);
      uVar3 = *puVar1;
      piVar7 = (int *)(puVar1 + -1);
      if (uVar9 == 0) {
        piVar7 = local_c0;
      }
      if (*piVar7 != uVar3) {
        if ((int)uVar3 < 0) {
          ear::dsp::block_convolver::BlockConvolver::fade_down(local_f0._M_head_impl);
        }
        else {
          ear::dsp::block_convolver::BlockConvolver::crossfade_filter
                    (local_f0._M_head_impl,
                     local_e8.
                     super__Vector_base<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar3);
        }
      }
      if (this->null_for_zeros == true) {
        Eigen::DenseBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator()(&local_a0,local_c8,&local_b8)
        ;
        _Var4._M_head_impl = local_f0._M_head_impl;
        if (local_a0.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
            super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
            m_rows.m_value < 0) {
          __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                        ,0x4a,
                        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Array<float, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Array<float, -1, 1>]"
                       );
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_a0.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
            super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
            m_rows.m_value != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          do {
            if ((local_a0.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
                 super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                 .m_data[(long)p_Var8] != 0.0) ||
               (NAN(local_a0.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
                    super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                    .m_data[(long)p_Var8]))) goto LAB_00117865;
            p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&p_Var8->_vptr__Sp_counted_base + 1);
          } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a0.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
                   super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                   .super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                   .m_rows.m_value != p_Var8);
        }
        Eigen::DenseBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator()(&local_a0,local_d0,&local_b8)
        ;
        ear::dsp::block_convolver::BlockConvolver::process
                  (_Var4._M_head_impl,(float *)0x0,
                   local_a0.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
                   super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                   .super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                   .m_data);
      }
      else {
LAB_00117865:
        _Var4._M_head_impl = local_f0._M_head_impl;
        Eigen::DenseBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator()(&local_a0,local_c8,&local_b8)
        ;
        in = local_a0.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
             super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
             m_data;
        Eigen::DenseBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator()(&local_68,local_d0,&local_b8)
        ;
        ear::dsp::block_convolver::BlockConvolver::process
                  (_Var4._M_head_impl,in,
                   local_68.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
                   super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                   .super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                   .m_data);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < this->num_blocks);
  }
  Eigen::internal::is_malloc_allowed_impl(bool,bool)::value = 1;
  std::
  unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
  ::~unique_ptr((unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
                 *)&local_f0);
  std::vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
  ::~vector(&local_e8);
  return;
}

Assistant:

void run_real_convolve(const Context &ctx) {
    // Create filters from irs, while finding the required number of blocks.
    std::vector<Filter> filters;
    for (size_t i = 0; i < irs.size(); i++) {
      Filter filter(ctx, irs[i].rows(), irs[i].data());
      if (filter.num_blocks() > max_num_blocks)
        max_num_blocks = filter.num_blocks();
      filters.push_back(std::move(filter));
    }

    std::unique_ptr<BlockConvolver> convolver;

    // Create the filter
    switch (constructor) {
      case NO_FILTER:
        convolver.reset(new BlockConvolver(ctx, max_num_blocks));
        break;
      case WITH_FILTER_NUM_BLOCKS:
        convolver.reset(
            new BlockConvolver(ctx, filters[initial_ir], max_num_blocks));
        break;
      case WITH_FILTER_NO_NUM_BLOCKS:
        convolver.reset(new BlockConvolver(ctx, filters[initial_ir]));
        break;
    }

    Eigen::internal::set_is_malloc_allowed(false);

    // don't set the starting filter if initial_ir is invalid
    if (initial_ir >= 0) {
      convolver->set_filter(filters[initial_ir]);
    }

    // filter each block
    for (size_t block = 0; block < num_blocks; block++) {
      const size_t offset = block_size * block;
      auto block_sel = Eigen::seqN(offset, block_size);

      // crossfade if the filter has changed
      int this_filter = ir_for_block[block];
      int last_filter = block == 0 ? initial_ir : ir_for_block[block - 1];
      if (last_filter != this_filter) {
        if (this_filter >= 0)
          convolver->crossfade_filter(filters[this_filter]);
        else
          convolver->fade_down();
      }

      // filter the block to the output; possibly passing null if zeros are
      // detected
      if (null_for_zeros && (input(block_sel).array() == 0.0).all()) {
        convolver->process(nullptr, real_output(block_sel).data());
      } else {
        convolver->process(input(block_sel).data(),
                           real_output(block_sel).data());
      }
    }
    Eigen::internal::set_is_malloc_allowed(true);
  }